

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_worker_finalizer(JSRuntime *rt,JSValue val)

{
  undefined8 *ptr;
  
  ptr = (undefined8 *)JS_GetOpaque(val,js_worker_class_id);
  if (ptr != (undefined8 *)0x0) {
    js_free_message_pipe((JSWorkerMessagePipe *)*ptr);
    js_free_message_pipe((JSWorkerMessagePipe *)ptr[1]);
    js_free_port(rt,(JSWorkerMessageHandler *)ptr[2]);
    js_free_rt(rt,ptr);
    return;
  }
  return;
}

Assistant:

static void js_worker_finalizer(JSRuntime *rt, JSValue val)
{
    JSWorkerData *worker = JS_GetOpaque(val, js_worker_class_id);
    if (worker) {
        js_free_message_pipe(worker->recv_pipe);
        js_free_message_pipe(worker->send_pipe);
        js_free_port(rt, worker->msg_handler);
        js_free_rt(rt, worker);
    }
}